

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_metrics.hpp
# Opt level: O0

double __thiscall
notch::metrics::ConfusionMatrix<int,_1>::classAverage
          (ConfusionMatrix<int,_1> *this,function<double_(int)> *metric)

{
  bool bVar1;
  reference ppVar2;
  reference piVar3;
  double dVar4;
  double class_value;
  iterator iStack_b8;
  int class__1;
  iterator __end0_1;
  iterator __begin0_1;
  vector<int,_std::allocator<int>_> *__range3_1;
  int *local_88;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_80;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_78;
  undefined1 local_6d;
  int local_6c;
  int iStack_68;
  bool hasClass;
  int class_;
  pair<const_std::pair<int,_int>,_int> p;
  iterator __end0;
  iterator __begin0;
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  *__range3;
  vector<int,_std::allocator<int>_> uniq;
  double dStack_20;
  int numClasses;
  double sum;
  function<double_(int)> *metric_local;
  ConfusionMatrix<int,_1> *this_local;
  
  dStack_20 = 0.0;
  uniq.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  memset(&__range3,0,0x18);
  core::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&__range3);
  __end0 = core::std::
           map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
           ::begin(&this->cm);
  register0x00000000 =
       core::std::
       map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
       ::end(&this->cm);
  while( true ) {
    bVar1 = core::std::operator!=(&__end0,(_Self *)&p.second);
    if (!bVar1) break;
    ppVar2 = core::std::_Rb_tree_iterator<std::pair<const_std::pair<int,_int>,_int>_>::operator*
                       (&__end0);
    p.first.first = ppVar2->second;
    _iStack_68 = ppVar2->first;
    local_6c = iStack_68;
    local_80._M_current =
         (int *)core::std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)&__range3);
    local_88 = (int *)core::std::vector<int,_std::allocator<int>_>::end
                                ((vector<int,_std::allocator<int>_> *)&__range3);
    local_78 = std::
               find<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                         (local_80,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                    )local_88,&local_6c);
    __range3_1 = (vector<int,_std::allocator<int>_> *)
                 core::std::vector<int,_std::allocator<int>_>::end
                           ((vector<int,_std::allocator<int>_> *)&__range3);
    local_6d = __gnu_cxx::operator!=
                         (&local_78,
                          (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                          &__range3_1);
    if (!(bool)local_6d) {
      core::std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&__range3,&local_6c);
      uniq.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           uniq.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_ + 1;
    }
    core::std::_Rb_tree_iterator<std::pair<const_std::pair<int,_int>,_int>_>::operator++(&__end0);
  }
  __end0_1 = core::std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)&__range3);
  iStack_b8 = core::std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)&__range3);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end0_1,&stack0xffffffffffffff48);
    if (!bVar1) break;
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end0_1);
    dVar4 = core::std::function<double_(int)>::operator()(metric,*piVar3);
    dStack_20 = dVar4 + dStack_20;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end0_1);
  }
  dVar4 = (double)uniq.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                  ._M_end_of_storage._4_4_;
  core::std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&__range3);
  return dStack_20 / dVar4;
}

Assistant:

double classAverage(std::function<double(C)> metric) {
        double sum = 0.0;
        int numClasses = 0;
        std::vector<C> uniq {};
        for (auto p : cm) { // find all uniq classes
            auto class_ = p.first.first;
            auto hasClass = std::find(uniq.begin(), uniq.end(), class_) != uniq.end();
            if (!hasClass) {
                uniq.push_back(class_);
                numClasses++;
            }
        }
        for (auto class_ : uniq) { // calculate the average
            double class_value = metric(class_);
            sum += class_value;
        }
        return sum / numClasses;
    }